

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Variant,8ul>::
emplace_back<diligent_spirv_cross::ObjectPoolGroup*>
          (SmallVector<diligent_spirv_cross::Variant,8ul> *this,ObjectPoolGroup **ts)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve
            ((SmallVector<diligent_spirv_cross::Variant,_8UL> *)this,*(long *)(this + 8) + 1);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  lVar3 = lVar2 * 0x18;
  *(ObjectPoolGroup **)(lVar1 + lVar3) = *ts;
  *(undefined8 *)(lVar1 + 8 + lVar3) = 0;
  *(undefined4 *)(lVar1 + 0x10 + lVar3) = 0;
  *(undefined1 *)(lVar1 + 0x14 + lVar3) = 0;
  *(long *)(this + 8) = lVar2 + 1;
  return;
}

Assistant:

void emplace_back(Ts &&... ts) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::forward<Ts>(ts)...);
		this->buffer_size++;
	}